

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uint uVar1;
  long in_RCX;
  long in_RDI;
  uint BTYPE;
  uint error;
  LodePNGBitReader reader;
  uint BFINAL;
  size_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  LodePNGBitReader *in_stack_ffffffffffffffa8;
  LodePNGDecompressSettings *in_stack_ffffffffffffffb8;
  LodePNGBitReader *in_stack_ffffffffffffffc0;
  ucvector *in_stack_ffffffffffffffc8;
  uint local_2c;
  
  local_2c = 0;
  uVar1 = LodePNGBitReader_init
                    (in_stack_ffffffffffffffa8,
                     (uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  while( true ) {
    if (uVar1 != 0) {
      return uVar1;
    }
    if (local_2c != 0) {
      return 0;
    }
    if ((ulong)((long)in_stack_ffffffffffffffb8 - (long)in_stack_ffffffffffffffc0) < 3) {
      return 0x34;
    }
    ensureBits9((LodePNGBitReader *)&stack0xffffffffffffffa8,3);
    local_2c = readBits((LodePNGBitReader *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffa0 =
         readBits((LodePNGBitReader *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98);
    if (in_stack_ffffffffffffffa0 == 3) break;
    if (in_stack_ffffffffffffffa0 == 0) {
      uVar1 = inflateNoCompression
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
    }
    else {
      uVar1 = inflateHuffmanBlock((ucvector *)insize,(LodePNGBitReader *)settings,BFINAL,
                                  reader._32_8_);
    }
    if (((uVar1 == 0) && (*(long *)(in_RCX + 8) != 0)) &&
       (*(ulong *)(in_RCX + 8) < *(ulong *)(in_RDI + 8))) {
      uVar1 = 0x6d;
    }
  }
  return 0x14;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(reader.bitsize - reader.bp < 3) return 52; /*error, bit pointer will jump past memory*/
    ensureBits9(&reader, 3);
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE, settings->max_output_size); /*compression, BTYPE 01 or 10*/
    if(!error && settings->max_output_size && out->size > settings->max_output_size) error = 109;
    if(error) break;
  }

  return error;
}